

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O3

void CheckFlicker(TidyDocImpl *doc,Node *node)

{
  TidyTagId TVar1;
  Bool BVar2;
  int iVar3;
  AttVal *av;
  uint maxExt;
  uint code;
  tmbchar ext [20];
  tmbchar atStack_38 [32];
  
  if (0xfffffffc < (doc->access).PRIORITYCHK - 4U) {
    if (node->tag != (Dict *)0x0) {
      TVar1 = node->tag->id;
      if ((int)TVar1 < 0x34) {
        if (TVar1 == TidyTag_APPLET) {
          code = 0x2e2;
        }
        else {
          if (TVar1 != TidyTag_EMBED) {
            return;
          }
          code = 0x2e1;
        }
      }
      else if (TVar1 == TidyTag_SCRIPT) {
        code = 0x2df;
      }
      else if (TVar1 == TidyTag_OBJECT) {
        code = 0x2e0;
      }
      else {
        if (TVar1 != TidyTag_IMG) {
          return;
        }
        av = prvTidyAttrGetById(node,TidyAttr_SRC);
        BVar2 = hasValue(av);
        if (BVar2 == no) {
          return;
        }
        GetFileExtension(av->value,atStack_38,maxExt);
        iVar3 = prvTidytmbstrcasecmp(atStack_38,".gif");
        if (iVar3 != 0) {
          return;
        }
        code = 0x2e3;
      }
      prvTidyReportAccessError(doc,node,code);
    }
  }
  return;
}

Assistant:

static void CheckFlicker( TidyDocImpl* doc, Node* node )
{
    if (Level1_Enabled( doc ))
    {
        int msgcode = 0;
        if ( nodeIsSCRIPT(node) )
            msgcode = REMOVE_FLICKER_SCRIPT;
        else if ( nodeIsOBJECT(node) )
            msgcode = REMOVE_FLICKER_OBJECT;
        else if ( nodeIsEMBED(node) )
            msgcode = REMOVE_FLICKER_EMBED;
        else if ( nodeIsAPPLET(node) )
            msgcode = REMOVE_FLICKER_APPLET;

        /* Checks for animated gif within the <img> tag. */
        else if ( nodeIsIMG(node) )
        {
            AttVal* av = attrGetSRC( node );
            if ( hasValue(av) )
            {
                tmbchar ext[20];
                GetFileExtension( av->value, ext, sizeof(ext) );
                if ( TY_(tmbstrcasecmp)(ext, ".gif") == 0 )
                    msgcode = REMOVE_FLICKER_ANIMATED_GIF;
            }
        }            

        if ( msgcode )
            TY_(ReportAccessError)( doc, node, msgcode );
    }
}